

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O0

int rs_read_coord(FILE *inf,coord *c)

{
  bool local_2b;
  bool local_29;
  int local_28;
  int local_24;
  coord in;
  coord *c_local;
  FILE *inf_local;
  
  if ((read_error == 0) && (format_error == 0)) {
    in = (coord)c;
    rs_read_int(inf,&local_28);
    rs_read_int(inf,&local_24);
    if (format_error == 0 && read_error == 0) {
      *(int *)in = local_28;
      *(int *)((long)in + 4) = local_24;
    }
    local_2b = format_error != 0 || read_error != 0;
    local_29 = local_2b;
  }
  else {
    local_29 = format_error != 0 || read_error != 0;
  }
  inf_local._4_4_ = (uint)local_29;
  return inf_local._4_4_;
}

Assistant:

static int rs_read_coord(FILE *inf, coord *c)
{
    coord in;

    if (read_error || format_error)
        return(READSTAT);

    rs_read_int(inf,&in.x);
    rs_read_int(inf,&in.y);

    if (READSTAT == 0) 
    {
        c->x = in.x;
        c->y = in.y;
    }

    return(READSTAT);
}